

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::OnDpRatioChangeRecursive(Element *this)

{
  int iVar1;
  ElementStyle *this_00;
  Element *this_01;
  int local_18;
  int i;
  int num_children;
  Element *this_local;
  
  ElementEffects::DirtyEffects(&this->meta->effects);
  this_00 = GetStyle(this);
  ElementStyle::DirtyPropertiesWithUnits(this_00,DP_SCALABLE_LENGTH);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xe])();
  iVar1 = GetNumChildren(this,true);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_01 = GetChild(this,local_18);
    OnDpRatioChangeRecursive(this_01);
  }
  return;
}

Assistant:

void Element::OnDpRatioChangeRecursive()
{
	meta->effects.DirtyEffects();
	GetStyle()->DirtyPropertiesWithUnits(Unit::DP_SCALABLE_LENGTH);

	OnDpRatioChange();

	// Now dirty all of our descendants.
	const int num_children = GetNumChildren(true);
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->OnDpRatioChangeRecursive();
}